

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O1

void randomx_vm_set_cache(randomx_vm *machine,randomx_cache *cache)

{
  size_t __n;
  int iVar1;
  
  __n = (machine->cacheKey)._M_string_length;
  if (__n == (cache->cacheKey)._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((machine->cacheKey)._M_dataplus._M_p,(cache->cacheKey)._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_0010d363;
    }
    if ((machine->mem).memory == cache->memory) {
      return;
    }
  }
LAB_0010d363:
  (*machine->_vptr_randomx_vm[6])(machine,cache);
  std::__cxx11::string::_M_assign((string *)&machine->cacheKey);
  return;
}

Assistant:

void randomx_vm_set_cache(randomx_vm *machine, randomx_cache* cache) {
		assert(machine != nullptr);
		assert(cache != nullptr && cache->isInitialized());
		if (machine->cacheKey != cache->cacheKey || machine->getMemory() != cache->memory) {
			machine->setCache(cache);
			machine->cacheKey = cache->cacheKey;
		}
	}